

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void pq_unlink_common(PacketQueueBase *pqb,PacketQueueNode *node)

{
  PacketQueueNode *pPVar1;
  PacketQueueNode *pPVar2;
  uint __line;
  size_t sVar3;
  char *__assertion;
  
  pPVar1 = node->next;
  pPVar2 = node->prev;
  pPVar1->prev = pPVar2;
  pPVar2->next = pPVar1;
  sVar3 = pqb->total_size - node->formal_size;
  if (pqb->total_size < node->formal_size) {
    __assertion = "pqb->total_size >= node->formal_size";
    __line = 0x56;
  }
  else {
    pqb->total_size = sVar3;
    if ((sVar3 == 0) || ((PacketQueueBase *)(pqb->end).next != pqb)) {
      return;
    }
    __assertion = "pqb->end.next != &pqb->end || pqb->total_size == 0";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                __line,"void pq_unlink_common(PacketQueueBase *, PacketQueueNode *)");
}

Assistant:

static inline void pq_unlink_common(PacketQueueBase *pqb,
                                    PacketQueueNode *node)
{
    node->next->prev = node->prev;
    node->prev->next = node->next;

    /* Check total_size doesn't drift out of sync downwards, by
     * ensuring it doesn't underflow when we do this subtraction */
    assert(pqb->total_size >= node->formal_size);
    pqb->total_size -= node->formal_size;

    /* Check total_size doesn't drift out of sync upwards, by checking
     * that it's returned to exactly zero whenever a queue is
     * emptied */
    assert(pqb->end.next != &pqb->end || pqb->total_size == 0);
}